

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

Transform * randomTransform(Transform *__return_storage_ptr__,RNG *rng)

{
  uint64_t uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  Transform *pTVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar21 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 in_XMM5 [16];
  Vector3f delta;
  Vector3f axis;
  undefined1 local_158 [16];
  Transform local_128;
  Transform local_a8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar26 = in_ZMM4._0_16_;
  auVar13 = in_ZMM3._0_16_;
  auVar25 = in_ZMM2._0_16_;
  auVar20 = in_ZMM0._0_16_;
  pbrt::Transform::Transform(__return_storage_ptr__);
  uVar12 = rng->state;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar20,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  rng->state = uVar12 * 0x5851f42d4c957f2d + rng->inc;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 4.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc0800000));
  dVar17 = pow(10.0,(double)auVar20._0_4_);
  uVar12 = rng->state;
  rng->state = uVar12 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar25,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 4.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc0800000));
  dVar18 = pow(10.0,(double)auVar20._0_4_);
  uVar12 = rng->state;
  rng->state = uVar12 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar25,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 4.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc0800000));
  dVar19 = pow(10.0,(double)auVar20._0_4_);
  pbrt::Scale(&local_128,(float)dVar17,(float)dVar18,(float)dVar19);
  pTVar9 = __return_storage_ptr__;
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  uVar12 = rng->state;
  rng->state = uVar12 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar13,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
  local_158._0_8_ = pow(10.0,(double)auVar20._0_4_);
  uVar12 = rng->state;
  local_158._8_8_ = extraout_XMM0_Qb;
  uVar11 = uVar12 * 0x5851f42d4c957f2d + rng->inc;
  rng->state = uVar11 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
  bVar10 = (byte)(uVar11 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar13,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
  auVar22._0_8_ = pow(10.0,(double)auVar20._0_4_);
  auVar22._8_56_ = extraout_var;
  auVar20 = vmovlhps_avx(local_158,auVar22._0_16_);
  uVar11 = rng->state * 0x5851f42d4c957f2d + rng->inc;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = rng->state;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar12;
  auVar25 = vpunpcklqdq_avx(auVar27,auVar24);
  auVar13 = vpsrlvq_avx2(auVar25,_DAT_0054e5b0);
  auVar14 = vpsrlvq_avx2(auVar25,_DAT_0054e5c0);
  auVar20 = vcvtpd2ps_avx(auVar20);
  auVar25 = vpsrlq_avx(auVar25,0x3b);
  auVar25 = vpshufd_avx(auVar25,0xe8);
  rng->state = uVar11 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
  bVar10 = (byte)(uVar11 >> 0x3b);
  auVar13 = vpshufd_avx(auVar13 ^ auVar14,0xe8);
  auVar25 = vprorvd_avx512vl(auVar13,auVar25);
  auVar13 = vcvtudq2ps_avx512vl(auVar25);
  auVar25._8_4_ = 0x2f800000;
  auVar25._0_8_ = 0x2f8000002f800000;
  auVar25._12_4_ = 0x2f800000;
  auVar25 = vmulps_avx512vl(auVar13,auVar25);
  auVar13._8_4_ = 0x3f7fffff;
  auVar13._0_8_ = 0x3f7fffff3f7fffff;
  auVar13._12_4_ = 0x3f7fffff;
  auVar25 = vminps_avx512vl(auVar25,auVar13);
  auVar14._8_4_ = 0x3f000000;
  auVar14._0_8_ = 0x3f0000003f000000;
  auVar14._12_4_ = 0x3f000000;
  uVar12 = vcmpps_avx512vl(auVar25,auVar14,0xe);
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar13 = vxorps_avx512vl(auVar20,auVar6);
  bVar2 = (bool)((byte)uVar12 & 1);
  bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
  auVar25 = vcvtusi2ss_avx512f(auVar26,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar25 = vminss_avx(ZEXT416((uint)(auVar25._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * 8.0)),
                            ZEXT416((uint)(1.0 - auVar25._0_4_)),ZEXT416(0xc1000000));
  auVar23._0_8_ = pow(10.0,(double)auVar25._0_4_);
  auVar23._8_56_ = extraout_var_00;
  uVar12 = rng->state;
  auVar21._0_4_ = (float)auVar23._0_8_;
  auVar21._4_12_ = auVar23._4_12_;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  auVar25 = vcvtusi2ss_avx512f(auVar26,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar25 = vminss_avx(ZEXT416((uint)(auVar25._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(auVar21,auVar7);
  rng->state = uVar12 * 0x5851f42d4c957f2d + rng->inc;
  uVar4 = vcmpss_avx512f(auVar25,ZEXT416(0x3f000000),0xe);
  bVar5 = (bool)((byte)uVar4 & 1);
  delta.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)bVar5 * (int)auVar21._0_4_ + (uint)!bVar5 * auVar14._0_4_);
  delta.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)((uint)bVar2 * auVar20._0_4_ | (uint)!bVar2 * auVar13._0_4_);
  delta.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)((uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * auVar13._4_4_);
  pbrt::Translate(&local_128,(pbrt *)pTVar9,delta);
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  uVar12 = rng->state;
  uVar1 = rng->inc;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar26,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  uVar12 = uVar12 * 0x5851f42d4c957f2d + uVar1;
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  uVar12 = uVar12 * 0x5851f42d4c957f2d + uVar1;
  auVar14 = SUB6416(ZEXT464(0x3f7fffff),0);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),auVar14);
  auVar25 = vcvtusi2ss_avx512f(in_XMM5,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  uVar8 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
  bVar10 = (byte)(uVar12 >> 0x3b);
  rng->state = uVar12 * 0x5851f42d4c957f2d + uVar1;
  auVar25 = vminss_avx(ZEXT416((uint)(auVar25._0_4_ * 2.3283064e-10)),auVar14);
  auVar13 = vcvtusi2ss_avx512f(in_XMM5,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar13 = vminss_avx(ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10)),auVar14);
  auVar26._0_8_ = (double)auVar13._0_4_;
  auVar26._8_8_ = auVar13._8_8_;
  auVar13 = vfmadd213sd_fma(auVar26,ZEXT816(0x4034000000000000),ZEXT816(0xc024000000000000));
  auVar14 = vfmadd132ss_fma(auVar20,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  auVar20 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar14,auVar14);
  auVar20 = vmaxss_avx(auVar20,ZEXT816(0) << 0x20);
  auVar20 = vsqrtss_avx(auVar20,auVar20);
  fVar16 = auVar25._0_4_ * 6.2831855;
  fVar15 = cosf(fVar16);
  fVar16 = sinf(fVar16);
  auVar20 = vinsertps_avx(ZEXT416((uint)(fVar15 * auVar20._0_4_)),
                          ZEXT416((uint)(fVar16 * auVar20._0_4_)),0x10);
  fVar16 = (float)(auVar13._0_8_ * 20.0) * 0.017453292;
  fVar15 = sinf(fVar16);
  fVar16 = cosf(fVar16);
  local_158._0_8_ = auVar20._0_8_;
  axis.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
  axis.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_158._0_4_;
  axis.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_158._4_4_;
  pbrt::Rotate(&local_128,fVar15,fVar16,axis);
  pTVar9 = pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  return pTVar9;
}

Assistant:

static Transform randomTransform(RNG &rng) {
    Transform t;
    auto rr = [&rng]() { return -10. + 20. * rng.Uniform<Float>(); };
    auto rt = [&rng]() {
        Float f = pExp(rng);
        return rng.Uniform<Float>() > .5 ? f : -f;
    };

    for (int i = 0; i < 1; ++i) {
        const Float s[3] = {pExp(rng, 4), pExp(rng, 4), pExp(rng, 4)};
        t = t * Scale(s[0], s[1], s[2]);
        t = t * Translate(Vector3f{rt(), rt(), rt()});
        Point2f u{rng.Uniform<Float>(), rng.Uniform<Float>()};
        t = t * Rotate(rr() * 20., SampleUniformSphere(u));
    }
    return t;
}